

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# voxelizer.h
# Opt level: O1

vx_aabb_t * vx__aabb_merge(vx_aabb_t *__return_storage_ptr__,vx_aabb_t *a,vx_aabb_t *b)

{
  float fVar1;
  float fVar2;
  
  fVar2 = (b->min).field_0.v[0];
  fVar1 = (a->min).field_0.v[0];
  if (fVar1 <= fVar2) {
    fVar2 = fVar1;
  }
  (__return_storage_ptr__->min).field_0.v[0] = fVar2;
  fVar2 = (b->min).field_0.v[1];
  fVar1 = (a->min).field_0.v[1];
  if (fVar1 <= fVar2) {
    fVar2 = fVar1;
  }
  (__return_storage_ptr__->min).field_0.v[1] = fVar2;
  fVar2 = (b->min).field_0.v[2];
  fVar1 = (a->min).field_0.v[2];
  if (fVar1 <= fVar2) {
    fVar2 = fVar1;
  }
  (__return_storage_ptr__->min).field_0.v[2] = fVar2;
  fVar2 = (a->max).field_0.v[0];
  fVar1 = (b->max).field_0.v[0];
  if (fVar2 <= fVar1) {
    fVar2 = fVar1;
  }
  (__return_storage_ptr__->max).field_0.v[0] = fVar2;
  fVar2 = (a->max).field_0.v[1];
  fVar1 = (b->max).field_0.v[1];
  if (fVar2 <= fVar1) {
    fVar2 = fVar1;
  }
  (__return_storage_ptr__->max).field_0.v[1] = fVar2;
  fVar2 = (a->max).field_0.v[2];
  fVar1 = (b->max).field_0.v[2];
  if (fVar2 <= fVar1) {
    fVar2 = fVar1;
  }
  (__return_storage_ptr__->max).field_0.v[2] = fVar2;
  return __return_storage_ptr__;
}

Assistant:

vx_aabb_t vx__aabb_merge(vx_aabb_t* a, vx_aabb_t* b)
{
    vx_aabb_t merge;

    merge.min.x = VX_MIN(a->min.x, b->min.x);
    merge.min.y = VX_MIN(a->min.y, b->min.y);
    merge.min.z = VX_MIN(a->min.z, b->min.z);

    merge.max.x = VX_MAX(a->max.x, b->max.x);
    merge.max.y = VX_MAX(a->max.y, b->max.y);
    merge.max.z = VX_MAX(a->max.z, b->max.z);

    return merge;
}